

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
* __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceConn
          (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
           *__return_storage_ptr__,PortConnectionBuilder *this,ASTContext *context,
          InterfacePortSymbol *port,ExpressionSyntax *syntax)

{
  size_t __n;
  __extent_storage<18446744073709551615UL> _Var1;
  pointer pCVar2;
  long lVar3;
  Scope *this_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> portDims_00;
  DeferredSourceRange sourceRange;
  span<const_slang::ConstantRange,_18446744073709551615UL> right;
  span<const_slang::ConstantRange,_18446744073709551615UL> left;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  Expression *pEVar9;
  Expression *this_01;
  undefined7 extraout_var;
  Type *this_02;
  DefinitionSymbol *this_03;
  Diagnostic *pDVar10;
  Diagnostic *pDVar11;
  ModportSymbol *pMVar12;
  Symbol *pSVar13;
  pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
  *extraout_RAX;
  char *pcVar14;
  long lVar15;
  ConstantRange this_04;
  size_t sVar16;
  ulong uVar17;
  __extent_storage<18446744073709551615UL> _Var18;
  InstanceArraySymbol *array;
  SourceRange SVar19;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_01;
  string_view arg;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_01;
  ModportSymbol *modport;
  Expression *expr;
  anon_class_40_5_9960d2bb makeResult;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> portDims;
  SmallVector<slang::ConstantRange,_4UL> dims;
  ModportSymbol *local_e8;
  ConstantRange local_e0;
  Expression *local_d8;
  undefined1 local_d0 [32];
  Expression **local_b0;
  pointer local_a8;
  __extent_storage<18446744073709551615UL> local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ExpressionSyntax *local_88;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_80;
  char local_70;
  undefined1 local_68 [56];
  
  local_e0 = (ConstantRange)this;
  pEVar9 = (Expression *)
           InterfacePortSymbol::getDeclaredRange
                     ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                      &local_80._M_value,port);
  if ((local_70 == '\0') ||
     (this_01 = Expression::tryBindInterfaceRef(context,syntax,true), pEVar9 = this_01,
     this_01 == (Expression *)0x0)) {
LAB_0028053a:
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
    return (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
            *)pEVar9;
  }
  local_d8 = this_01;
  bVar7 = Expression::bad(this_01);
  pEVar9 = (Expression *)CONCAT71(extraout_var,bVar7);
  if (bVar7) goto LAB_0028053a;
  local_68._0_8_ = (long)local_68 + 0x18;
  local_68._8_8_ = 0;
  local_68._16_8_ = 4;
  this_02 = (this_01->type).ptr;
  while (bVar7 = Type::isUnpackedArray(this_02), bVar7) {
    local_d0._0_8_ = Type::getFixedRange(this_02);
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
              ((SmallVectorBase<slang::ConstantRange> *)local_68,(ConstantRange *)local_d0);
    this_02 = Type::getArrayElementType(this_02);
  }
  this_03 = InstanceSymbol::getDefinition(*(InstanceSymbol **)&this_02[1].super_Symbol);
  if ((this_03 == port->interfaceDef) || (port->isGeneric != false)) {
    local_e8 = (ModportSymbol *)this_02[1].super_Symbol.name._M_len;
    __n = (port->modport)._M_len;
    pMVar12 = local_e8;
    if (__n == 0) {
LAB_0028075d:
      local_e8 = pMVar12;
      uVar6 = local_68._8_8_;
      uVar5 = local_68._0_8_;
      uVar4 = local_80._M_value._M_ptr;
      this_04 = local_e0;
      local_d0._0_4_ = local_e0.left;
      local_d0._4_4_ = local_e0.right;
      local_d0._24_8_ = &local_e8;
      local_b0 = &local_d8;
      pSVar13 = *(Symbol **)(local_d8 + 1);
      left._M_extent._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
      left._M_ptr = local_80._M_value._M_ptr;
      right_00._M_extent._M_extent_value = local_68._8_8_;
      right_00._M_ptr = (pointer)local_68._0_8_;
      local_a0._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
      local_d0._8_8_ = port;
      local_d0._16_8_ = &local_80;
      bVar7 = areDimSizesEqual(left,right_00);
      if (bVar7) {
        portDims_00._M_extent._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
        portDims_00._M_ptr = local_80._M_value._M_ptr;
        pSVar13 = rewireIfaceArrayIndices
                            ((PortConnectionBuilder *)this_04,pSVar13,(port->super_Symbol).name,
                             (port->super_Symbol).location,portDims_00);
        (__return_storage_ptr__->first).first = pSVar13;
        (__return_storage_ptr__->first).second = local_e8;
        __return_storage_ptr__->second = local_d8;
        goto LAB_00280960;
      }
      local_a8 = (pointer)uVar4;
      _Var1._M_extent_value = *(ulong *)((long)this_04 + 0x1e8);
      if (_Var1._M_extent_value <= (ulong)uVar6) {
        _Var18._M_extent_value = uVar6;
        if (_Var1._M_extent_value != 0xffffffffffffffff) {
          _Var18._M_extent_value = _Var1._M_extent_value;
        }
        pCVar2 = *(pointer *)((long)this_04 + 0x1e0);
        right_01._M_extent._M_extent_value = _Var1._M_extent_value;
        right_01._M_ptr = pCVar2;
        left_00._M_extent._M_extent_value = _Var18._M_extent_value;
        left_00._M_ptr = (pointer)uVar5;
        bVar7 = areDimSizesEqual(left_00,right_01);
        this_04 = local_e0;
        if ((bVar7) &&
           (left_01._M_ptr = (pointer)(uVar5 + _Var1._M_extent_value * 8),
           right._M_extent._M_extent_value = local_a0._M_extent_value, right._M_ptr = local_a8,
           left_01._M_extent._M_extent_value = uVar6 - _Var1._M_extent_value,
           bVar7 = areDimSizesEqual(left_01,right), this_04 = local_e0, bVar7)) {
          lVar3 = *(long *)(*(long *)((long)local_e0 + 8) + 0x48);
          if (lVar3 != 0) {
            lVar15 = 0;
            do {
              uVar17 = (ulong)*(uint *)(*(long *)(*(long *)((long)local_e0 + 8) + 0x40) + lVar15 * 4
                                       );
              if (pCVar2[lVar15].right <= pCVar2[lVar15].left !=
                  *(int *)((long)&pSVar13[2].name._M_len + 4) <= (int)pSVar13[2].name._M_len) {
                uVar17 = ~uVar17 + *(long *)(pSVar13 + 2);
              }
              pSVar13 = *(Symbol **)(&(pSVar13[1].originatingSyntax)->kind + uVar17 * 2);
              lVar15 = lVar15 + 1;
            } while (lVar3 != lVar15);
          }
          getInterfaceConn::anon_class_40_5_9960d2bb::operator()
                    (__return_storage_ptr__,(anon_class_40_5_9960d2bb *)local_d0,pSVar13);
          goto LAB_00280960;
        }
      }
      this_00 = *(Scope **)this_04;
      SVar19 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      pDVar10 = Scope::addDiag(this_00,(DiagCode)0x9d0006,SVar19);
      pDVar10 = Diagnostic::operator<<(pDVar10,(port->super_Symbol).name);
      Diagnostic::addNote(pDVar10,(DiagCode)0x50001,(port->super_Symbol).location);
    }
    else {
      if ((local_e8 != (ModportSymbol *)0x0) &&
         (((local_e8->super_Symbol).name._M_len != __n ||
          (iVar8 = bcmp((local_e8->super_Symbol).name._M_str,(port->modport)._M_str,__n), iVar8 != 0
          )))) {
        SVar19 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x820006,SVar19);
        pDVar11 = Diagnostic::operator<<(pDVar10,(this_03->super_Symbol).name);
        Diagnostic::operator<<(pDVar11,(local_e8->super_Symbol).name);
        if (port->isGeneric == false) {
          sVar16 = (port->interfaceDef->super_Symbol).name._M_len;
          pcVar14 = (port->interfaceDef->super_Symbol).name._M_str;
        }
        else {
          pcVar14 = "interface";
          sVar16 = 9;
        }
        arg._M_str = pcVar14;
        arg._M_len = sVar16;
        Diagnostic::operator<<(pDVar10,arg);
        Diagnostic::operator<<(pDVar10,port->modport);
        goto LAB_00280952;
      }
      local_98 = 0;
      uStack_90 = 0;
      sourceRange.node.value = (uintptr_t)syntax;
      sourceRange.range = (SourceRange)ZEXT816(0);
      local_88 = syntax;
      pMVar12 = InterfacePortSymbol::getModport
                          (port,context,*(InstanceSymbol **)&this_02[1].super_Symbol,sourceRange);
      if (pMVar12 != (ModportSymbol *)0x0) goto LAB_0028075d;
    }
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
  }
  else {
    SVar19 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    pDVar10 = ASTContext::addDiag(context,(DiagCode)0x540006,SVar19);
    Symbol::getHierarchicalPath_abi_cxx11_((string *)local_d0,&this_03->super_Symbol);
    pDVar11 = Diagnostic::operator<<(pDVar10,(string *)local_d0);
    Diagnostic::operator<<(pDVar11,(port->interfaceDef->super_Symbol).name);
    if (local_d0._0_8_ != (long)local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,(size_t)(local_d0._16_8_ + 1));
    }
    Diagnostic::addNote(pDVar10,(DiagCode)0x50001,(port->super_Symbol).location);
LAB_00280952:
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
  }
LAB_00280960:
  if (local_68._0_8_ == (long)local_68 + 0x18) {
    return (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
            *)((long)local_68 + 0x18);
  }
  operator_delete((void *)local_68._0_8_);
  return extraout_RAX;
}

Assistant:

std::pair<PortConnection::IfaceConn, const Expression*> getInterfaceConn(
        ASTContext& context, const InterfacePortSymbol& port, const ExpressionSyntax& syntax) {
        SLANG_ASSERT(!port.isInvalid());

        auto makeError = []() -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{nullptr, nullptr}, nullptr};
        };

        auto portDims = port.getDeclaredRange();
        if (!portDims)
            return makeError();

        auto expr = Expression::tryBindInterfaceRef(context, syntax,
                                                    /* isInterfacePort */ true);
        if (!expr || expr->bad())
            return makeError();

        // Pull out the expression type, which should always be a virtual interface or
        // array of such types, and decompose into dims and interface info.
        SmallVector<ConstantRange, 4> dims;
        auto type = expr->type;
        while (type->isUnpackedArray()) {
            dims.push_back(type->getFixedRange());
            type = type->getArrayElementType();
        }

        auto& vit = type->as<VirtualInterfaceType>();
        auto& connDef = vit.iface.getDefinition();

        SLANG_ASSERT(vit.isRealIface);
        SLANG_ASSERT(port.isGeneric || port.interfaceDef);
        if (&connDef != port.interfaceDef && !port.isGeneric) {
            auto& diag = context.addDiag(diag::InterfacePortTypeMismatch, syntax.sourceRange());
            diag << connDef.getHierarchicalPath() << port.interfaceDef->name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return makeError();
        }

        // Modport must match the specified requirement, if we have one.
        auto modport = vit.modport;
        if (!port.modport.empty()) {
            if (modport && modport->name != port.modport) {
                auto& diag = context.addDiag(diag::ModportConnMismatch, syntax.sourceRange());
                diag << connDef.name << modport->name;
                diag << (port.isGeneric ? "interface"sv : port.interfaceDef->name);
                diag << port.modport;
                return makeError();
            }

            auto sym = port.getModport(context, vit.iface, syntax);
            if (!sym)
                return makeError();

            modport = sym;
        }

        auto makeResult =
            [&](const Symbol* symbol) -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{rewireIfaceArrayIndices(symbol, port.name, port.location, *portDims), modport},
                    expr};
        };

        // Make the connection if the dimensions match exactly what the port is expecting.
        const Symbol* symbol = expr->as<ArbitrarySymbolExpression>().symbol;
        if (areDimSizesEqual(*portDims, dims))
            return makeResult(symbol);

        // Otherwise, if the instance being instantiated is part of an array of instances *and*
        // the symbol we're connecting to is an array of interfaces, we need to check to see whether
        // to slice up that array among all the instances. We do the slicing operation if:
        // instance array dimensions + port dimensions == connection dimensions
        std::span<const ConstantRange> dimSpan = dims;
        if (dimSpan.size() >= instanceDims.size() &&
            areDimSizesEqual(dimSpan.subspan(0, instanceDims.size()), instanceDims) &&
            areDimSizesEqual(dimSpan.subspan(instanceDims.size()), *portDims)) {

            // It's ok to do the slicing, so pick the correct slice for the connection
            // based on the actual path of the instance we're elaborating.
            for (size_t i = 0; i < instance.arrayPath.size(); i++) {
                // We want to match left index to left index, so if the dimensions
                // are in reversed order we need to reverse our index here.
                auto& array = symbol->as<InstanceArraySymbol>();
                size_t index = instance.arrayPath[i];
                if (instanceDims[i].isLittleEndian() != array.range.isLittleEndian())
                    index = array.elements.size() - index - 1;

                symbol = array.elements[index];
            }

            return makeResult(symbol);
        }

        auto& diag = scope.addDiag(diag::PortConnDimensionsMismatch, syntax.sourceRange())
                     << port.name;
        diag.addNote(diag::NoteDeclarationHere, port.location);
        return makeError();
    }